

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::testShader
               (NegativeTestContext *ctx,ImageOperation function,MemoryQualifier memory,
               TextureType imageType,TextureFormat *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Shader *pSVar2;
  size_type sVar3;
  RenderContext *renderCtx;
  undefined6 uVar4;
  _anonymous_namespace_ *p_Var5;
  _Alloc_hider _Var6;
  bool bVar7;
  deUint32 dVar8;
  long *plVar9;
  undefined8 *puVar10;
  char *__s;
  mapped_type *pmVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar12;
  ulong uVar13;
  size_t sVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined4 in_register_0000000c;
  ulong *puVar16;
  Shader **ppSVar17;
  MemoryQualifier extraout_EDX;
  MemoryQualifier extraout_EDX_00;
  MemoryQualifier extraout_EDX_01;
  MemoryQualifier memory_00;
  ImageOperation extraout_EDX_02;
  ImageOperation extraout_EDX_03;
  ImageOperation extraout_EDX_04;
  ImageOperation function_00;
  TextureFormat *extraout_RDX;
  TextureFormat *extraout_RDX_00;
  TextureFormat *format_00;
  long lVar18;
  uint uVar19;
  undefined4 in_register_00000034;
  Shader *pSVar20;
  undefined8 uVar21;
  bool *pbVar22;
  char *pcVar23;
  string shaderSource;
  ostringstream declaration;
  ShaderProgram program;
  undefined1 local_380 [16];
  undefined1 local_370 [31];
  byte local_351;
  _anonymous_namespace_ *local_350;
  NegativeTestContext *local_348;
  MemoryQualifier local_33c;
  string local_338;
  TextureFormat *local_318;
  ulong local_310;
  string local_308;
  undefined1 local_2e8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8 [6];
  ios_base local_278 [8];
  ios_base local_270 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_258;
  undefined1 local_238 [208];
  long local_168;
  ulong local_160;
  TestLog *local_158;
  ulong local_150;
  string local_148;
  string local_128;
  long local_108;
  undefined1 local_100 [16];
  Shader *local_f0;
  _Base_ptr p_Stack_e8;
  _Base_ptr local_e0;
  pointer local_d8;
  
  local_350 = (_anonymous_namespace_ *)CONCAT44(in_register_00000034,function);
  local_150 = CONCAT44(in_register_0000000c,imageType);
  local_158 = (ctx->super_CallLogWrapper).m_log;
  local_348 = ctx;
  local_33c = memory;
  local_318 = format;
  NegativeTestShared::(anonymous_namespace)::getFunctionName_abi_cxx11_(&local_308,local_350,memory)
  ;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_308);
  paVar15 = &local_338.field_2;
  puVar16 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_338.field_2._M_allocated_capacity = *puVar16;
    local_338.field_2._8_8_ = plVar9[3];
    local_338._M_dataplus._M_p = (pointer)paVar15;
  }
  else {
    local_338.field_2._M_allocated_capacity = *puVar16;
    local_338._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_338._M_string_length = plVar9[1];
  *plVar9 = (long)puVar16;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  NegativeTestShared::(anonymous_namespace)::getMemoryQualifier_abi_cxx11_
            (&local_128,(_anonymous_namespace_ *)(ulong)local_33c,
             (MemoryQualifier)local_338._M_string_length);
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar15) {
    uVar21 = local_338.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_128._M_string_length + local_338._M_string_length) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      uVar21 = local_128.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_128._M_string_length + local_338._M_string_length) goto LAB_01618242;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_128,0,(char *)0x0,(ulong)local_338._M_dataplus._M_p);
  }
  else {
LAB_01618242:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_128._M_dataplus._M_p);
  }
  local_380._0_8_ = local_370;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 == paVar1) {
    sVar3 = paVar1->_M_allocated_capacity;
    uVar21 = puVar10[3];
    local_370[0] = (undefined1)sVar3;
    local_370[1] = (undefined1)(sVar3 >> 8);
    local_370[2] = (undefined1)(sVar3 >> 0x10);
    local_370[3] = (undefined1)(sVar3 >> 0x18);
    local_370[4] = (undefined1)(sVar3 >> 0x20);
    local_370[5] = (undefined1)(sVar3 >> 0x28);
    local_370[6] = (undefined1)(sVar3 >> 0x30);
    local_370[7] = (undefined1)(sVar3 >> 0x38);
    local_370._8_5_ = (undefined5)uVar21;
    local_370[0xd] = (undefined1)((ulong)uVar21 >> 0x28);
    local_370._14_2_ = (undefined2)((ulong)uVar21 >> 0x30);
  }
  else {
    sVar3 = paVar1->_M_allocated_capacity;
    local_370[0] = (undefined1)sVar3;
    local_370[1] = (undefined1)(sVar3 >> 8);
    local_370[2] = (undefined1)(sVar3 >> 0x10);
    local_370[3] = (undefined1)(sVar3 >> 0x18);
    local_370[4] = (undefined1)(sVar3 >> 0x20);
    local_370[5] = (undefined1)(sVar3 >> 0x28);
    local_370[6] = (undefined1)(sVar3 >> 0x30);
    local_370[7] = (undefined1)(sVar3 >> 0x38);
    local_380._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar10;
  }
  local_380._8_8_ = puVar10[1];
  *puVar10 = paVar1;
  puVar10[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  plVar9 = (long *)std::__cxx11::string::append(local_380);
  ppSVar17 = (Shader **)(plVar9 + 2);
  if ((Shader **)*plVar9 == ppSVar17) {
    local_f0 = *ppSVar17;
    p_Stack_e8 = (_Base_ptr)plVar9[3];
    local_100._0_8_ = &local_f0;
  }
  else {
    local_f0 = *ppSVar17;
    local_100._0_8_ = (Shader **)*plVar9;
  }
  local_100._8_8_ = plVar9[1];
  *plVar9 = (long)ppSVar17;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  NegativeTestShared::(anonymous_namespace)::getShaderImageLayoutQualifier_abi_cxx11_
            (&local_148,(_anonymous_namespace_ *)local_318,(TextureFormat *)local_100._8_8_);
  pSVar2 = (Shader *)((long)(ChannelOrder *)local_100._8_8_ + local_148._M_string_length);
  pSVar20 = (Shader *)0xf;
  if ((Shader **)local_100._0_8_ != &local_f0) {
    pSVar20 = local_f0;
  }
  if (pSVar20 < pSVar2) {
    uVar21 = (Shader *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      uVar21 = local_148.field_2._M_allocated_capacity;
    }
    if (pSVar2 <= (ulong)uVar21) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,local_100._0_8_);
      goto LAB_0161839e;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append(local_100,(ulong)local_148._M_dataplus._M_p);
LAB_0161839e:
  local_2e8 = (undefined1  [8])local_2d8;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 == paVar1) {
    sVar3 = paVar1->_M_allocated_capacity;
    uVar21 = puVar10[3];
    local_2d8[0]._M_local_buf[0] = (undefined1)sVar3;
    local_2d8[0]._M_local_buf[1] = (undefined1)(sVar3 >> 8);
    local_2d8[0]._M_allocated_capacity._2_4_ = (undefined4)(sVar3 >> 0x10);
    local_2d8[0]._M_local_buf[6] = (undefined1)(sVar3 >> 0x30);
    local_2d8[0]._M_local_buf[7] = (undefined1)(sVar3 >> 0x38);
    local_2d8[0]._8_2_ = (undefined2)uVar21;
    local_2d8[0]._M_local_buf[10] = (undefined1)((ulong)uVar21 >> 0x10);
    local_2d8[0]._M_local_buf[0xb] = (undefined1)((ulong)uVar21 >> 0x18);
    local_2d8[0]._12_2_ = (undefined2)((ulong)uVar21 >> 0x20);
    local_2d8[0]._M_local_buf[0xe] = (undefined1)((ulong)uVar21 >> 0x30);
    local_2d8[0]._M_local_buf[0xf] = (undefined1)((ulong)uVar21 >> 0x38);
  }
  else {
    sVar3 = paVar1->_M_allocated_capacity;
    local_2d8[0]._M_local_buf[0] = (undefined1)sVar3;
    local_2d8[0]._M_local_buf[1] = (undefined1)(sVar3 >> 8);
    local_2d8[0]._M_allocated_capacity._2_4_ = (undefined4)(sVar3 >> 0x10);
    local_2d8[0]._M_local_buf[6] = (undefined1)(sVar3 >> 0x30);
    local_2d8[0]._M_local_buf[7] = (undefined1)(sVar3 >> 0x38);
    local_2e8 = (undefined1  [8])*puVar10;
  }
  local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10[1];
  *puVar10 = paVar1;
  puVar10[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  NegativeTestContext::beginSection(local_348,(string *)local_2e8);
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,
                    CONCAT17(local_2d8[0]._M_local_buf[7],
                             CONCAT16(local_2d8[0]._M_local_buf[6],
                                      CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                               CONCAT11(local_2d8[0]._M_local_buf[1],
                                                        local_2d8[0]._M_local_buf[0])))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,(ulong)(local_148.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((Shader **)local_100._0_8_ != &local_f0) {
    operator_delete((void *)local_100._0_8_,(ulong)((long)&local_f0->m_gl + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370) {
    operator_delete((void *)local_380._0_8_,
                    CONCAT17(local_370[7],
                             CONCAT16(local_370[6],
                                      CONCAT15(local_370[5],
                                               CONCAT14(local_370[4],
                                                        CONCAT13(local_370[3],
                                                                 CONCAT12(local_370[2],
                                                                          CONCAT11(local_370[1],
                                                                                   local_370[0])))))
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar15) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  uVar13 = local_150;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  local_351 = ~(0x9fU >> ((byte)uVar13 & 0x1f));
  local_160 = uVar13 & 0xffffffff;
  local_168 = local_160 * 4;
  lVar18 = 0;
  do {
    local_310 = (ulong)(uint)(&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar18];
    bVar7 = NegativeTestContext::isShaderSupported
                      (local_348,(&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar18]);
    if (bVar7) {
      local_100._0_8_ = &local_f0;
      local_108 = lVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Verify shader: ","");
      glu::getShaderTypeName((ShaderType)local_310);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_100);
      local_2e8 = (undefined1  [8])local_2d8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 == paVar15) {
        sVar3 = paVar15->_M_allocated_capacity;
        lVar18 = plVar9[3];
        local_2d8[0]._M_local_buf[0] = (undefined1)sVar3;
        local_2d8[0]._M_local_buf[1] = (undefined1)(sVar3 >> 8);
        local_2d8[0]._M_allocated_capacity._2_4_ = (undefined4)(sVar3 >> 0x10);
        local_2d8[0]._M_local_buf[6] = (undefined1)(sVar3 >> 0x30);
        local_2d8[0]._M_local_buf[7] = (undefined1)(sVar3 >> 0x38);
        local_2d8[0]._8_2_ = (undefined2)lVar18;
        local_2d8[0]._M_local_buf[10] = (undefined1)((ulong)lVar18 >> 0x10);
        local_2d8[0]._M_local_buf[0xb] = (undefined1)((ulong)lVar18 >> 0x18);
        local_2d8[0]._12_2_ = (undefined2)((ulong)lVar18 >> 0x20);
        local_2d8[0]._M_local_buf[0xe] = (undefined1)((ulong)lVar18 >> 0x30);
        local_2d8[0]._M_local_buf[0xf] = (undefined1)((ulong)lVar18 >> 0x38);
      }
      else {
        sVar3 = paVar15->_M_allocated_capacity;
        local_2d8[0]._M_local_buf[0] = (undefined1)sVar3;
        local_2d8[0]._M_local_buf[1] = (undefined1)(sVar3 >> 8);
        local_2d8[0]._M_allocated_capacity._2_4_ = (undefined4)(sVar3 >> 0x10);
        local_2d8[0]._M_local_buf[6] = (undefined1)(sVar3 >> 0x30);
        local_2d8[0]._M_local_buf[7] = (undefined1)(sVar3 >> 0x38);
        local_2e8 = (undefined1  [8])*plVar9;
      }
      local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar9[1];
      *plVar9 = (long)paVar15;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      NegativeTestContext::beginSection(local_348,(string *)local_2e8);
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                   CONCAT11(local_2d8[0]._M_local_buf[1],
                                                            local_2d8[0]._M_local_buf[0])))) + 1);
      }
      if ((Shader **)local_100._0_8_ != &local_f0) {
        operator_delete((void *)local_100._0_8_,(ulong)((long)&local_f0->m_gl + 1));
      }
      local_100._8_8_ = local_100._8_8_ & 0xffffffff00000000;
      local_f0 = (Shader *)0x0;
      p_Stack_e8 = (_Base_ptr)(local_100 + 8);
      local_d8 = (pointer)0x0;
      local_e0 = p_Stack_e8;
      __s = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
      local_2e8 = (undefined1  [8])local_2d8;
      local_380._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x11;
      local_2e8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_2e8,(ulong)local_380);
      local_2d8[0]._M_local_buf[0] = (undefined1)local_380._0_8_;
      local_2d8[0]._M_local_buf[1] = SUB81(local_380._0_8_,1);
      local_2d8[0]._M_allocated_capacity._2_4_ = SUB84(local_380._0_8_,2);
      local_2d8[0]._M_local_buf[6] = SUB81(local_380._0_8_,6);
      local_2d8[0]._M_local_buf[7] = SUB81(local_380._0_8_,7);
      *(undefined8 *)local_2e8 = 0x5245565f4c534c47;
      *(char *)((long)local_2e8 + 8) = 'S';
      *(char *)((long)local_2e8 + 9) = 'I';
      *(char *)((long)local_2e8 + 10) = 'O';
      *(char *)((long)local_2e8 + 0xb) = 'N';
      *(char *)((long)local_2e8 + 0xc) = '_';
      *(char *)((long)local_2e8 + 0xd) = 'D';
      *(char *)((long)local_2e8 + 0xe) = 'E';
      *(char *)((long)local_2e8 + 0xf) = 'C';
      *(char *)((long)local_2e8 + 0x10) = 'L';
      local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._0_8_;
      *(char *)((long)local_2e8 + local_380._0_8_) = '\0';
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_100,(key_type *)local_2e8);
      pcVar23 = (char *)pmVar11->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)pmVar11,0,pcVar23,(ulong)__s);
      uVar13 = local_150;
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                   CONCAT11(local_2d8[0]._M_local_buf[1],
                                                            local_2d8[0]._M_local_buf[0])))) + 1);
      }
      uVar19 = (uint)uVar13;
      local_2e8 = (undefined1  [8])local_2d8;
      local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_2d8[0]._M_local_buf[0] = '\0';
      if (uVar19 < 8 && (local_351 & 1) == 0) {
        std::__cxx11::string::_M_replace
                  ((ulong)local_2e8,0,(char *)0x0,
                   (ulong)(&DAT_01cbc518 + *(int *)(&DAT_01cbc518 + local_168)));
        paVar15 = local_2d8;
        local_370[3] = (undefined1)((uint)local_2d8[0]._2_4_ >> 8);
        local_370[4] = (undefined1)((uint)local_2d8[0]._2_4_ >> 0x10);
        local_370[5] = (undefined1)((uint)local_2d8[0]._2_4_ >> 0x18);
        if (local_2e8 == (undefined1  [8])paVar15) {
          uVar4 = CONCAT24(local_2d8[0]._12_2_,
                           CONCAT13(local_2d8[0]._M_local_buf[0xb],
                                    CONCAT12(local_2d8[0]._M_local_buf[10],local_2d8[0]._8_2_)));
          local_370._8_5_ = (undefined5)uVar4;
          local_370[0xd] = (undefined1)((ushort)local_2d8[0]._12_2_ >> 8);
          local_370._14_2_ =
               (undefined2)
               (CONCAT17(local_2d8[0]._M_local_buf[0xf],
                         CONCAT16(local_2d8[0]._M_local_buf[0xe],uVar4)) >> 0x30);
          local_380._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_370;
        }
        else {
          local_380._0_8_ = local_2e8;
        }
        local_370[1] = local_2d8[0]._M_local_buf[1];
        local_370[0] = local_2d8[0]._M_local_buf[0];
        local_370[2] = (undefined1)local_2d8[0]._M_allocated_capacity._2_4_;
        local_370[6] = local_2d8[0]._M_local_buf[6];
        local_370[7] = local_2d8[0]._M_local_buf[7];
        local_380._8_8_ = local_2e0;
        ppaVar12 = &local_2e0;
      }
      else {
        ppaVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(local_380 + 8);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_370;
        local_380._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_370;
      }
      local_2e8 = (undefined1  [8])local_2d8;
      *ppaVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      paVar15->_M_local_buf[0] = '\0';
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                   CONCAT11(local_2d8[0]._M_local_buf[1],
                                                            local_2d8[0]._M_local_buf[0])))) + 1);
      }
      local_2e8 = (undefined1  [8])local_2d8;
      local_308._M_dataplus._M_p = &DAT_00000013;
      local_2e8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_2e8,(ulong)&local_308);
      local_2d8[0]._M_local_buf[0] = SUB81(local_308._M_dataplus._M_p,0);
      local_2d8[0]._M_local_buf[1] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 8);
      local_2d8[0]._M_allocated_capacity._2_4_ =
           (undefined4)((ulong)local_308._M_dataplus._M_p >> 0x10);
      local_2d8[0]._M_local_buf[6] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x30);
      local_2d8[0]._M_local_buf[7] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_2e8 = 0x5059545f4c534c47;
      *(char *)((long)local_2e8 + 8) = 'E';
      *(char *)((long)local_2e8 + 9) = '_';
      *(char *)((long)local_2e8 + 10) = 'E';
      *(char *)((long)local_2e8 + 0xb) = 'X';
      *(char *)((long)local_2e8 + 0xc) = 'T';
      *(char *)((long)local_2e8 + 0xd) = 'E';
      *(char *)((long)local_2e8 + 0xe) = 'N';
      *(char *)((long)local_2e8 + 0xf) = 'S';
      *(char *)((long)local_2e8 + 0xf) = 'S';
      *(char *)((long)local_2e8 + 0x10) = 'I';
      *(char *)((long)local_2e8 + 0x11) = 'O';
      *(char *)((long)local_2e8 + 0x12) = 'N';
      local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p;
      *(char *)((long)local_2e8 + (long)local_308._M_dataplus._M_p) = '\0';
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_100,(key_type *)local_2e8);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)local_380);
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                   CONCAT11(local_2d8[0]._M_local_buf[1],
                                                            local_2d8[0]._M_local_buf[0])))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370) {
        operator_delete((void *)local_380._0_8_,
                        CONCAT17(local_370[7],
                                 CONCAT16(local_370[6],
                                          CONCAT15(local_370[5],
                                                   CONCAT14(local_370[4],
                                                            CONCAT13(local_370[3],
                                                                     CONCAT12(local_370[2],
                                                                              CONCAT11(local_370[1],
                                                                                       local_370[0])
                                                                             )))))) + 1);
      }
      if ((int)local_350 - 2U < 8) {
        local_2e8 = (undefined1  [8])local_2d8;
        local_380._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x2e;
        local_2e8 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_2e8,(ulong)local_380);
        local_2d8[0]._M_local_buf[0] = (undefined1)local_380._0_8_;
        local_2d8[0]._M_local_buf[1] = SUB81(local_380._0_8_,1);
        local_2d8[0]._M_allocated_capacity._2_4_ = SUB84(local_380._0_8_,2);
        local_2d8[0]._M_local_buf[6] = SUB81(local_380._0_8_,6);
        local_2d8[0]._M_local_buf[7] = SUB81(local_380._0_8_,7);
        *(char *)((long)local_2e8 + 0x1e) = '_';
        *(char *)((long)local_2e8 + 0x1f) = 'a';
        *(char *)((long)local_2e8 + 0x20) = 't';
        *(char *)((long)local_2e8 + 0x21) = 'o';
        *(char *)((long)local_2e8 + 0x22) = 'm';
        *(char *)((long)local_2e8 + 0x23) = 'i';
        *(char *)((long)local_2e8 + 0x24) = 'c';
        *(char *)((long)local_2e8 + 0x25) = ' ';
        *(char *)((long)local_2e8 + 0x26) = ':';
        *(char *)((long)local_2e8 + 0x27) = ' ';
        *(char *)((long)local_2e8 + 0x28) = 'e';
        *(char *)((long)local_2e8 + 0x29) = 'n';
        *(char *)((long)local_2e8 + 0x2a) = 'a';
        *(char *)((long)local_2e8 + 0x2b) = 'b';
        *(char *)((long)local_2e8 + 0x2c) = 'l';
        *(char *)((long)local_2e8 + 0x2d) = 'e';
        *(char *)((long)local_2e8 + 0x10) = 'S';
        *(char *)((long)local_2e8 + 0x11) = '_';
        *(char *)((long)local_2e8 + 0x12) = 's';
        *(char *)((long)local_2e8 + 0x13) = 'h';
        *(char *)((long)local_2e8 + 0x14) = 'a';
        *(char *)((long)local_2e8 + 0x15) = 'd';
        *(char *)((long)local_2e8 + 0x16) = 'e';
        *(char *)((long)local_2e8 + 0x17) = 'r';
        *(char *)((long)local_2e8 + 0x18) = '_';
        *(char *)((long)local_2e8 + 0x19) = 'i';
        *(char *)((long)local_2e8 + 0x1a) = 'm';
        *(char *)((long)local_2e8 + 0x1b) = 'a';
        *(char *)((long)local_2e8 + 0x1c) = 'g';
        *(char *)((long)local_2e8 + 0x1d) = 'e';
        *(char *)((long)local_2e8 + 0x1e) = '_';
        *(char *)((long)local_2e8 + 0x1f) = 'a';
        *(undefined8 *)local_2e8 = 0x69736e6574786523;
        *(char *)((long)local_2e8 + 8) = 'o';
        *(char *)((long)local_2e8 + 9) = 'n';
        *(char *)((long)local_2e8 + 10) = ' ';
        *(char *)((long)local_2e8 + 0xb) = 'G';
        *(char *)((long)local_2e8 + 0xc) = 'L';
        *(char *)((long)local_2e8 + 0xd) = '_';
        *(char *)((long)local_2e8 + 0xe) = 'O';
        *(char *)((long)local_2e8 + 0xf) = 'E';
        local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_380._0_8_;
        *(char *)((long)local_2e8 + local_380._0_8_) = '\0';
      }
      else {
        local_2e8 = (undefined1  [8])local_2d8;
        local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        local_2d8[0]._M_local_buf[0] = '\0';
      }
      local_308._M_dataplus._M_p = (pointer)0x17;
      local_380._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_370;
      local_380._0_8_ = std::__cxx11::string::_M_create((ulong *)local_380,(ulong)&local_308);
      local_370[0] = SUB81(local_308._M_dataplus._M_p,0);
      local_370[1] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 8);
      local_370[2] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x10);
      local_370[3] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x18);
      local_370[4] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x20);
      local_370[5] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x28);
      local_370[6] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x30);
      local_370[7] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_380._0_8_ = 0x4e55465f4c534c47;
      *(char *)(local_380._0_8_ + 8) = 'C';
      *(char *)(local_380._0_8_ + 9) = 'T';
      *(char *)(local_380._0_8_ + 10) = 'I';
      *(char *)(local_380._0_8_ + 0xb) = 'O';
      *(char *)(local_380._0_8_ + 0xc) = 'N';
      *(char *)(local_380._0_8_ + 0xd) = '_';
      *(char *)(local_380._0_8_ + 0xe) = 'E';
      *(char *)(local_380._0_8_ + 0xf) = 'X';
      *(char *)(local_380._0_8_ + 0xf) = 'X';
      *(char *)(local_380._0_8_ + 0x10) = 'T';
      *(char *)(local_380._0_8_ + 0x11) = 'E';
      *(char *)(local_380._0_8_ + 0x12) = 'N';
      *(char *)(local_380._0_8_ + 0x13) = 'S';
      *(char *)(local_380._0_8_ + 0x14) = 'I';
      *(char *)(local_380._0_8_ + 0x15) = 'O';
      *(char *)(local_380._0_8_ + 0x16) = 'N';
      local_380._8_8_ = local_308._M_dataplus._M_p;
      *(char *)(local_380._0_8_ + (long)local_308._M_dataplus._M_p) = '\0';
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_100,(key_type *)local_380);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370) {
        operator_delete((void *)local_380._0_8_,
                        CONCAT17(local_370[7],
                                 CONCAT16(local_370[6],
                                          CONCAT15(local_370[5],
                                                   CONCAT14(local_370[4],
                                                            CONCAT13(local_370[3],
                                                                     CONCAT12(local_370[2],
                                                                              CONCAT11(local_370[1],
                                                                                       local_370[0])
                                                                             )))))) + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                   CONCAT11(local_2d8[0]._M_local_buf[1],
                                                            local_2d8[0]._M_local_buf[0])))) + 1);
      }
      dVar8 = glu::getGLShaderType((ShaderType)local_310);
      pcVar23 = "";
      if (dVar8 == 0x8dd9) {
        pcVar23 = "layout(max_vertices = 3) out;";
      }
      local_2e8 = (undefined1  [8])local_2d8;
      local_380._0_8_ = &DAT_00000016;
      local_2e8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_2e8,(ulong)local_380);
      local_2d8[0]._M_local_buf[0] = (undefined1)local_380._0_8_;
      local_2d8[0]._M_local_buf[1] = SUB81(local_380._0_8_,1);
      local_2d8[0]._M_allocated_capacity._2_4_ = SUB84(local_380._0_8_,2);
      local_2d8[0]._M_local_buf[6] = SUB81(local_380._0_8_,6);
      local_2d8[0]._M_local_buf[7] = SUB81(local_380._0_8_,7);
      *(undefined8 *)local_2e8 = 0x595254454d4f4547;
      *(char *)((long)local_2e8 + 8) = '_';
      *(char *)((long)local_2e8 + 9) = 'S';
      *(char *)((long)local_2e8 + 10) = 'H';
      *(char *)((long)local_2e8 + 0xb) = 'A';
      *(char *)((long)local_2e8 + 0xc) = 'D';
      *(char *)((long)local_2e8 + 0xd) = 'E';
      *(char *)((long)local_2e8 + 0xe) = 'R';
      *(char *)((long)local_2e8 + 0xf) = '_';
      *(char *)((long)local_2e8 + 0xe) = 'R';
      *(char *)((long)local_2e8 + 0xf) = '_';
      *(char *)((long)local_2e8 + 0x10) = 'L';
      *(char *)((long)local_2e8 + 0x11) = 'A';
      *(char *)((long)local_2e8 + 0x12) = 'Y';
      *(char *)((long)local_2e8 + 0x13) = 'O';
      *(char *)((long)local_2e8 + 0x14) = 'U';
      *(char *)((long)local_2e8 + 0x15) = 'T';
      local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._0_8_;
      *(char *)((long)local_2e8 + local_380._0_8_) = '\0';
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_100,(key_type *)local_2e8);
      std::__cxx11::string::_M_replace
                ((ulong)pmVar11,0,(char *)pmVar11->_M_string_length,(ulong)pcVar23);
      format_00 = extraout_RDX;
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                   CONCAT11(local_2d8[0]._M_local_buf[1],
                                                            local_2d8[0]._M_local_buf[0])))) + 1);
        format_00 = extraout_RDX_00;
      }
      NegativeTestShared::(anonymous_namespace)::getShaderImageLayoutQualifier_abi_cxx11_
                ((string *)local_2e8,(_anonymous_namespace_ *)local_318,format_00);
      local_370._8_5_ = 0x54414d524f;
      local_370[0] = 'L';
      local_370[1] = 'A';
      local_370[2] = 'Y';
      local_370[3] = 'O';
      local_370[4] = 'U';
      local_370[5] = 'T';
      local_370[6] = '_';
      local_370[7] = 'F';
      local_380._8_8_ = 0xd;
      local_370[0xd] = '\0';
      local_380._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_370;
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_100,(key_type *)local_380);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)local_2e8);
      memory_00 = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370) {
        operator_delete((void *)local_380._0_8_,
                        CONCAT17(local_370[7],
                                 CONCAT16(local_370[6],
                                          CONCAT15(local_370[5],
                                                   CONCAT14(local_370[4],
                                                            CONCAT13(local_370[3],
                                                                     CONCAT12(local_370[2],
                                                                              CONCAT11(local_370[1],
                                                                                       local_370[0])
                                                                             )))))) + 1);
        memory_00 = extraout_EDX_00;
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                   CONCAT11(local_2d8[0]._M_local_buf[1],
                                                            local_2d8[0]._M_local_buf[0])))) + 1);
        memory_00 = extraout_EDX_01;
      }
      NegativeTestShared::(anonymous_namespace)::getMemoryQualifier_abi_cxx11_
                ((string *)local_2e8,(_anonymous_namespace_ *)(ulong)local_33c,memory_00);
      local_308._M_dataplus._M_p = (pointer)0x10;
      local_380._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_370;
      local_380._0_8_ = std::__cxx11::string::_M_create((ulong *)local_380,(ulong)&local_308);
      local_370[0] = SUB81(local_308._M_dataplus._M_p,0);
      local_370[1] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 8);
      local_370[2] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x10);
      local_370[3] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x18);
      local_370[4] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x20);
      local_370[5] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x28);
      local_370[6] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x30);
      local_370[7] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_380._0_8_ = 0x515f59524f4d454d;
      *(char *)(local_380._0_8_ + 8) = 'U';
      *(char *)(local_380._0_8_ + 9) = 'A';
      *(char *)(local_380._0_8_ + 10) = 'L';
      *(char *)(local_380._0_8_ + 0xb) = 'I';
      *(char *)(local_380._0_8_ + 0xc) = 'F';
      *(char *)(local_380._0_8_ + 0xd) = 'I';
      *(char *)(local_380._0_8_ + 0xe) = 'E';
      *(char *)(local_380._0_8_ + 0xf) = 'R';
      local_380._8_8_ = local_308._M_dataplus._M_p;
      *(char *)(local_380._0_8_ + (long)local_308._M_dataplus._M_p) = '\0';
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_100,(key_type *)local_380);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370) {
        operator_delete((void *)local_380._0_8_,
                        CONCAT17(local_370[7],
                                 CONCAT16(local_370[6],
                                          CONCAT15(local_370[5],
                                                   CONCAT14(local_370[4],
                                                            CONCAT13(local_370[3],
                                                                     CONCAT12(local_370[2],
                                                                              CONCAT11(local_370[1],
                                                                                       local_370[0])
                                                                             )))))) + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                   CONCAT11(local_2d8[0]._M_local_buf[1],
                                                            local_2d8[0]._M_local_buf[0])))) + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
      uVar13 = (ulong)local_318->type;
      if (uVar13 < 0x24) {
        if ((0xc00000009U >> (uVar13 & 0x3f) & 1) == 0) {
          lVar18 = 1;
          if ((0x38000000UL >> (uVar13 & 0x3f) & 1) == 0) {
            if ((0x2c0000000U >> (uVar13 & 0x3f) & 1) == 0) goto LAB_01618cf9;
            pbVar22 = (bool *)0x1b19cf4;
          }
          else {
            pbVar22 = (bool *)0x1c858c1;
          }
        }
        else {
          pbVar22 = glcts::fixed_sample_locations_values + 1;
          lVar18 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,pbVar22,lVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,"image",5);
        if (7 < uVar19 || (local_351 & 1) != 0) goto LAB_01618cf9;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2e8,&DAT_01cbc4b8 + *(int *)(&DAT_01cbc4b8 + local_168),
                   *(long *)(&DAT_01cbc4d8 + local_160 * 8));
        std::__cxx11::stringbuf::str();
      }
      else {
LAB_01618cf9:
        local_380._8_8_ = (pointer)0x0;
        local_370[0] = '\0';
        local_380._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_370;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
      std::ios_base::~ios_base(local_278);
      local_2d8[0]._M_local_buf[0] = 'I';
      local_2d8[0]._M_local_buf[1] = 'M';
      local_2d8[0]._M_allocated_capacity._2_4_ = 0x5f454741;
      local_2d8[0]._M_local_buf[6] = 'T';
      local_2d8[0]._M_local_buf[7] = 'Y';
      local_2d8[0]._8_2_ = 0x4550;
      local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0xa;
      local_2d8[0]._M_local_buf[10] = '\0';
      local_2e8 = (undefined1  [8])local_2d8;
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_100,(key_type *)local_2e8);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)local_380);
      function_00 = extraout_EDX_02;
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                   CONCAT11(local_2d8[0]._M_local_buf[1],
                                                            local_2d8[0]._M_local_buf[0])))) + 1);
        function_00 = extraout_EDX_03;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370) {
        operator_delete((void *)local_380._0_8_,
                        CONCAT17(local_370[7],
                                 CONCAT16(local_370[6],
                                          CONCAT15(local_370[5],
                                                   CONCAT14(local_370[4],
                                                            CONCAT13(local_370[3],
                                                                     CONCAT12(local_370[2],
                                                                              CONCAT11(local_370[1],
                                                                                       local_370[0])
                                                                             )))))) + 1);
        function_00 = extraout_EDX_04;
      }
      NegativeTestShared::(anonymous_namespace)::getFunctionName_abi_cxx11_
                ((string *)local_2e8,local_350,function_00);
      local_370._8_5_ = 0x454d414e5f;
      local_370[0] = 'F';
      local_370[1] = 'U';
      local_370[2] = 'N';
      local_370[3] = 'C';
      local_370[4] = 'T';
      local_370[5] = 'I';
      local_370[6] = 'O';
      local_370[7] = 'N';
      local_380._8_8_ = 0xd;
      local_370[0xd] = '\0';
      local_380._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_370;
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_100,(key_type *)local_380);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370) {
        operator_delete((void *)local_380._0_8_,
                        CONCAT17(local_370[7],
                                 CONCAT16(local_370[6],
                                          CONCAT15(local_370[5],
                                                   CONCAT14(local_370[4],
                                                            CONCAT13(local_370[3],
                                                                     CONCAT12(local_370[2],
                                                                              CONCAT11(local_370[1],
                                                                                       local_370[0])
                                                                             )))))) + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                   CONCAT11(local_2d8[0]._M_local_buf[1],
                                                            local_2d8[0]._M_local_buf[0])))) + 1);
      }
      p_Var5 = local_350;
      if (uVar19 - 1 < 4) {
        local_2d8[0]._8_2_ = 0x3120;
        local_2d8[0]._M_local_buf[10] = ',';
        local_2d8[0]._M_local_buf[0xb] = ' ';
        local_2d8[0]._12_2_ = 0x2931;
        local_2d8[0]._M_local_buf[0] = 'i';
        local_2d8[0]._M_local_buf[1] = 'v';
        local_2d8[0]._M_allocated_capacity._2_4_ = 0x28336365;
        local_2d8[0]._M_local_buf[6] = '1';
        local_2d8[0]._M_local_buf[7] = ',';
        local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0xe;
        local_2d8[0]._M_local_buf[0xe] = '\0';
      }
      else if (uVar19 == 7) {
        local_2d8[0]._M_local_buf[0] = '1';
        local_2d8[0]._M_local_buf[1] = '\0';
        local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&DAT_00000001;
      }
      else if (uVar19 == 0) {
        local_2d8[0]._M_local_buf[0] = 'i';
        local_2d8[0]._M_local_buf[1] = 'v';
        local_2d8[0]._M_allocated_capacity._2_4_ = 0x28326365;
        local_2d8[0]._M_local_buf[6] = '1';
        local_2d8[0]._M_local_buf[7] = ',';
        local_2d8[0]._8_2_ = 0x3120;
        local_2d8[0]._M_local_buf[10] = ')';
        local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0xb;
        local_2d8[0]._M_local_buf[0xb] = '\0';
      }
      else {
        local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        local_2d8[0]._M_local_buf[0] = '\0';
      }
      local_2e8 = (undefined1  [8])local_2d8;
      local_370._8_5_ = 0x505f4d4152;
      local_370[0] = 'I';
      local_370[1] = 'M';
      local_370[2] = 'A';
      local_370[3] = 'G';
      local_370[4] = 'E';
      local_370[5] = '_';
      local_370[6] = 'P';
      local_370[7] = 'A';
      local_380._8_8_ = 0xd;
      local_370[0xd] = '\0';
      local_380._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_370;
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_100,(key_type *)local_380);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370) {
        operator_delete((void *)local_380._0_8_,
                        CONCAT17(local_370[7],
                                 CONCAT16(local_370[6],
                                          CONCAT15(local_370[5],
                                                   CONCAT14(local_370[4],
                                                            CONCAT13(local_370[3],
                                                                     CONCAT12(local_370[2],
                                                                              CONCAT11(local_370[1],
                                                                                       local_370[0])
                                                                             )))))) + 1);
      }
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                   CONCAT11(local_2d8[0]._M_local_buf[1],
                                                            local_2d8[0]._M_local_buf[0])))) + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,", ",2);
      uVar13 = (ulong)local_318->type;
      if (uVar13 < 0x24) {
        if ((0xc00000009U >> (uVar13 & 0x3f) & 1) == 0) {
          pcVar23 = "i";
          if ((0x38000000UL >> (uVar13 & 0x3f) & 1) == 0) {
            if ((0x2c0000000U >> (uVar13 & 0x3f) & 1) == 0) goto switchD_01619054_caseD_1;
            pcVar23 = "u";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,pcVar23,1);
          pcVar23 = ", 1";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2e8,glcts::fixed_sample_locations_values + 1,0);
          pcVar23 = ", 1.0";
        }
        switch((ulong)p_Var5 & 0xffffffff) {
        case 0:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2e8,"vec4(1, 1, 1, 1)",0x10);
          std::__cxx11::stringbuf::str();
          break;
        default:
          goto switchD_01619054_caseD_1;
        case 2:
        case 3:
        case 4:
        case 5:
        case 6:
        case 7:
          local_370[2] = '1';
          local_370[0] = ',';
          local_370[1] = ' ';
          local_380._8_8_ = 3;
          local_370[3] = '\0';
          local_380._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_370;
          break;
        case 8:
          local_380._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_370;
          sVar14 = strlen(pcVar23);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_380,pcVar23,pcVar23 + sVar14);
          break;
        case 9:
          local_370[4] = ' ';
          local_370[5] = '1';
          local_370[0] = ',';
          local_370[1] = ' ';
          local_370[2] = '1';
          local_370[3] = ',';
          local_380._8_8_ = 6;
          local_370[6] = '\0';
          local_380._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_370;
        }
      }
      else {
switchD_01619054_caseD_1:
        local_380._8_8_ = 0;
        local_370[0] = '\0';
        local_380._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_370;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
      std::ios_base::~ios_base(local_278);
      local_2e8 = (undefined1  [8])local_2d8;
      local_308._M_dataplus._M_p = (pointer)0x12;
      local_2e8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_2e8,(ulong)&local_308);
      local_2d8[0]._M_local_buf[0] = SUB81(local_308._M_dataplus._M_p,0);
      local_2d8[0]._M_local_buf[1] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 8);
      local_2d8[0]._M_allocated_capacity._2_4_ =
           (undefined4)((ulong)local_308._M_dataplus._M_p >> 0x10);
      local_2d8[0]._M_local_buf[6] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x30);
      local_2d8[0]._M_local_buf[7] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_2e8 = 0x4e4f4954434e5546;
      *(char *)((long)local_2e8 + 8) = '_';
      *(char *)((long)local_2e8 + 9) = 'A';
      *(char *)((long)local_2e8 + 10) = 'R';
      *(char *)((long)local_2e8 + 0xb) = 'G';
      *(char *)((long)local_2e8 + 0xc) = 'U';
      *(char *)((long)local_2e8 + 0xd) = 'M';
      *(char *)((long)local_2e8 + 0xe) = 'E';
      *(char *)((long)local_2e8 + 0xf) = 'N';
      *(char *)((long)local_2e8 + 0x10) = 'T';
      *(char *)((long)local_2e8 + 0x11) = 'S';
      local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p;
      *(char *)((long)local_2e8 + (long)local_308._M_dataplus._M_p) = '\0';
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_100,(key_type *)local_2e8);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)local_380);
      if (local_2e8 != (undefined1  [8])local_2d8) {
        operator_delete((void *)local_2e8,
                        CONCAT17(local_2d8[0]._M_local_buf[7],
                                 CONCAT16(local_2d8[0]._M_local_buf[6],
                                          CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                   CONCAT11(local_2d8[0]._M_local_buf[1],
                                                            local_2d8[0]._M_local_buf[0])))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370) {
        operator_delete((void *)local_380._0_8_,
                        CONCAT17(local_370[7],
                                 CONCAT16(local_370[6],
                                          CONCAT15(local_370[5],
                                                   CONCAT14(local_370[4],
                                                            CONCAT13(local_370[3],
                                                                     CONCAT12(local_370[2],
                                                                              CONCAT11(local_370[1],
                                                                                       local_370[0])
                                                                             )))))) + 1);
      }
      local_308._M_dataplus._M_p = (pointer)0x115;
      local_380._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_370;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::__cxx11::string::_M_create((ulong *)local_380,(ulong)&local_308);
      _Var6._M_p = local_308._M_dataplus._M_p;
      local_370[0] = SUB81(local_308._M_dataplus._M_p,0);
      local_370[1] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 8);
      local_370[2] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x10);
      local_370[3] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x18);
      local_370[4] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x20);
      local_370[5] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x28);
      local_370[6] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x30);
      local_370[7] = (undefined1)((ulong)local_308._M_dataplus._M_p >> 0x38);
      local_380._0_8_ = paVar15;
      memcpy(paVar15,
             "${GLSL_VERSION_DECL}\n${GLSL_TYPE_EXTENSION}\n${GLSL_FUNCTION_EXTENSION}\n${GEOMETRY_SHADER_LAYOUT}\nlayout(${LAYOUT_FORMAT}, binding = 0) highp uniform ${MEMORY_QUALIFIER} ${IMAGE_TYPE} u_img0;\nvoid main(void)\n{\n ${FUNCTION_NAME}(u_img0, ${IMAGE_PARAM_P}${FUNCTION_ARGUMENTS});\n}\n"
             ,0x115);
      local_380._8_8_ = _Var6._M_p;
      paVar15->_M_local_buf[(long)_Var6._M_p] = '\0';
      tcu::StringTemplate::StringTemplate((StringTemplate *)local_2e8,(string *)local_380);
      tcu::StringTemplate::specialize
                (&local_338,(StringTemplate *)local_2e8,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_100);
      tcu::StringTemplate::~StringTemplate((StringTemplate *)local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370) {
        operator_delete((void *)local_380._0_8_,
                        CONCAT17(local_370[7],
                                 CONCAT16(local_370[6],
                                          CONCAT15(local_370[5],
                                                   CONCAT14(local_370[4],
                                                            CONCAT13(local_370[3],
                                                                     CONCAT12(local_370[2],
                                                                              CONCAT11(local_370[1],
                                                                                       local_370[0])
                                                                             )))))) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_100);
      renderCtx = local_348->m_renderCtx;
      local_238[0x10] = 0;
      local_238._17_8_ = 0;
      local_238._0_8_ = (pointer)0x0;
      local_238[8] = 0;
      local_238._9_7_ = 0;
      memset((MessageBuilder *)local_2e8,0,0xac);
      local_380._0_4_ = (int)local_310;
      local_380._8_8_ = local_370 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_380 + 8),local_338._M_dataplus._M_p,
                 local_338._M_dataplus._M_p + local_338._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2e8 + (local_380._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_380 + 8));
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_100,renderCtx,(ProgramSources *)local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_370 + 8)) {
        operator_delete((void *)local_380._8_8_,
                        CONCAT26(local_370._14_2_,CONCAT15(local_370[0xd],local_370._8_5_)) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_238);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_258);
      lVar18 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2e8 + lVar18));
        lVar18 = lVar18 + -0x18;
      } while (lVar18 != -0x18);
      if (*(char *)(**(long **)(local_100 + local_310 * 0x18) + 0x58) == '\x01') {
        glu::operator<<(local_158,(ShaderProgram *)local_100);
        local_2e8 = (undefined1  [8])local_158;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_2e0,"Expected program to fail, but compilation passed.",0x31);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2e0);
        std::ios_base::~ios_base(local_270);
        local_2e8 = (undefined1  [8])local_2d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2e8,"Shader was not expected to compile.","");
        NegativeTestContext::fail(local_348,(string *)local_2e8);
        if (local_2e8 != (undefined1  [8])local_2d8) {
          operator_delete((void *)local_2e8,
                          CONCAT17(local_2d8[0]._M_local_buf[7],
                                   CONCAT16(local_2d8[0]._M_local_buf[6],
                                            CONCAT42(local_2d8[0]._M_allocated_capacity._2_4_,
                                                     CONCAT11(local_2d8[0]._M_local_buf[1],
                                                              local_2d8[0]._M_local_buf[0])))) + 1);
        }
      }
      NegativeTestContext::endSection(local_348);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
      lVar18 = local_108;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        lVar18 = local_108;
      }
    }
    lVar18 = lVar18 + 1;
    if (lVar18 == 6) {
      NegativeTestContext::endSection(local_348);
      return;
    }
  } while( true );
}

Assistant:

void testShader (NegativeTestContext& ctx, ImageOperation function, MemoryQualifier memory, glu::TextureTestUtil::TextureType imageType, const tcu::TextureFormat& format)
{
	tcu::TestLog& log = ctx.getLog();
	ctx.beginSection(getFunctionName(function) + " " + getMemoryQualifier(memory) + " " + getShaderImageLayoutQualifier(format));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_shaders); ndx++)
	{
		if (ctx.isShaderSupported(s_shaders[ndx]))
		{
			ctx.beginSection(std::string("Verify shader: ") + glu::getShaderTypeName(s_shaders[ndx]));
			std::string					shaderSource(generateShaderSource(function, memory, imageType, format, s_shaders[ndx]));
			const glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources() << glu::ShaderSource(s_shaders[ndx], shaderSource));
			if (program.getShaderInfo(s_shaders[ndx]).compileOk)
			{
				log << program;
				log << tcu::TestLog::Message << "Expected program to fail, but compilation passed." << tcu::TestLog::EndMessage;
				ctx.fail("Shader was not expected to compile.");
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}